

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool mkvparser::Colour::Parse
               (IMkvReader *reader,longlong colour_start,longlong colour_size,Colour **colour)

{
  Colour *this;
  pointer pCVar1;
  long lVar2;
  long *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long status;
  longlong child_size;
  longlong child_id;
  longlong read_pos;
  longlong colour_end;
  unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> colour_ptr;
  pointer in_stack_fffffffffffffef8;
  unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> *in_stack_ffffffffffffff00;
  longlong *in_stack_ffffffffffffff08;
  longlong *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  longlong *in_stack_ffffffffffffff20;
  IMkvReader *in_stack_ffffffffffffff28;
  undefined1 local_1;
  
  if ((in_RDI == 0) || (*in_RCX != 0)) {
    local_1 = false;
  }
  else {
    this = (Colour *)operator_new(0x70);
    Colour(this);
    std::unique_ptr<mkvparser::Colour,std::default_delete<mkvparser::Colour>>::
    unique_ptr<std::default_delete<mkvparser::Colour>,void>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    pCVar1 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::get
                       (in_stack_ffffffffffffff00);
    if (pCVar1 == (pointer)0x0) {
      local_1 = false;
    }
    else if (in_RSI < in_RSI + in_RDX) {
      lVar2 = ParseElementHeader(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                 CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      if (lVar2 < 0) {
        local_1 = false;
      }
      else {
        local_1 = false;
      }
    }
    else {
      pCVar1 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::release
                         ((unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> *)
                          0x187801);
      *in_RCX = (long)pCVar1;
      local_1 = true;
    }
    std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::~unique_ptr
              (in_stack_ffffffffffffff00);
  }
  return local_1;
}

Assistant:

bool Colour::Parse(IMkvReader* reader, long long colour_start,
                   long long colour_size, Colour** colour) {
  if (!reader || *colour)
    return false;

  std::unique_ptr<Colour> colour_ptr(new Colour());
  if (!colour_ptr.get())
    return false;

  const long long colour_end = colour_start + colour_size;
  long long read_pos = colour_start;

  while (read_pos < colour_end) {
    long long child_id = 0;
    long long child_size = 0;

    const long status =
        ParseElementHeader(reader, read_pos, colour_end, child_id, child_size);
    if (status < 0)
      return false;

    if (child_id == libwebm::kMkvMatrixCoefficients) {
      colour_ptr->matrix_coefficients =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->matrix_coefficients < 0)
        return false;
    } else if (child_id == libwebm::kMkvBitsPerChannel) {
      colour_ptr->bits_per_channel =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->bits_per_channel < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSubsamplingHorz) {
      colour_ptr->chroma_subsampling_horz =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_subsampling_horz < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSubsamplingVert) {
      colour_ptr->chroma_subsampling_vert =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_subsampling_vert < 0)
        return false;
    } else if (child_id == libwebm::kMkvCbSubsamplingHorz) {
      colour_ptr->cb_subsampling_horz =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->cb_subsampling_horz < 0)
        return false;
    } else if (child_id == libwebm::kMkvCbSubsamplingVert) {
      colour_ptr->cb_subsampling_vert =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->cb_subsampling_vert < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSitingHorz) {
      colour_ptr->chroma_siting_horz =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_siting_horz < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSitingVert) {
      colour_ptr->chroma_siting_vert =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_siting_vert < 0)
        return false;
    } else if (child_id == libwebm::kMkvRange) {
      colour_ptr->range = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->range < 0)
        return false;
    } else if (child_id == libwebm::kMkvTransferCharacteristics) {
      colour_ptr->transfer_characteristics =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->transfer_characteristics < 0)
        return false;
    } else if (child_id == libwebm::kMkvPrimaries) {
      colour_ptr->primaries = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->primaries < 0)
        return false;
    } else if (child_id == libwebm::kMkvMaxCLL) {
      colour_ptr->max_cll = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->max_cll < 0)
        return false;
    } else if (child_id == libwebm::kMkvMaxFALL) {
      colour_ptr->max_fall = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->max_fall < 0)
        return false;
    } else if (child_id == libwebm::kMkvMasteringMetadata) {
      if (!MasteringMetadata::Parse(reader, read_pos, child_size,
                                    &colour_ptr->mastering_metadata))
        return false;
    } else {
      return false;
    }

    read_pos += child_size;
    if (read_pos > colour_end)
      return false;
  }
  *colour = colour_ptr.release();
  return true;
}